

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O2

bool __thiscall
FMB::FiniteModelMultiSorted::evaluateGroundLiteral(FiniteModelMultiSorted *this,Literal *lit)

{
  char cVar1;
  uint uVar2;
  uint64_t uVar3;
  uint uVar4;
  UserErrorException *pUVar5;
  OperatorType *this_00;
  TermList TVar6;
  int iVar7;
  uint idx;
  ulong uVar8;
  ulong size;
  bool bVar9;
  DArray<unsigned_int> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  size = (ulong)*(uint *)(*(long *)(*(long *)(DAT_00a14190 + 0x80) +
                                   (long)(int)(lit->super_Term)._functor * 8) + 0x20);
  Lib::DArray<unsigned_int>::DArray(&args,size);
  iVar7 = 0;
  uVar8 = 0;
  while (size != uVar8) {
    uVar4 = evaluateGroundTerm(this,(Term *)(lit->super_Term)._args
                                            [(int)((*(uint *)&(lit->super_Term).field_0xc &
                                                   0xfffffff) + iVar7)]._content);
    args._array[uVar8] = uVar4;
    uVar8 = uVar8 + 1;
    iVar7 = iVar7 + -1;
    if (uVar4 == 0) {
      pUVar5 = (UserErrorException *)__cxa_allocate_exception(0x50);
      Kernel::Literal::toString_abi_cxx11_(&local_90,lit);
      std::operator+(&local_70,"Could not evaluate ",&local_90);
      std::operator+(&local_110,&local_70," on ");
      Kernel::Term::toString_abi_cxx11_
                (&local_b0,
                 (Term *)(lit->super_Term)._args
                         [(int)(((*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) - (int)uVar8) +
                               1)]._content,true);
      std::operator+(&local_f0,&local_110,&local_b0);
      std::operator+(&local_50,&local_f0,", probably a partial model");
      Lib::UserErrorException::Exception(pUVar5,&local_50);
      __cxa_throw(pUVar5,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
  }
  uVar8 = (ulong)(lit->super_Term)._functor;
  if (uVar8 == 0) {
    bVar9 = *args._array == args._array[1];
  }
  else {
    this_00 = Kernel::Signature::Symbol::predType
                        (*(Symbol **)(*(long *)(DAT_00a14190 + 0x80) + uVar8 * 8));
    uVar4 = (this->_p_offsets)._array[(lit->super_Term)._functor];
    iVar7 = 1;
    for (idx = 0; idx < args._size; idx = idx + 1) {
      uVar2 = args._array[idx];
      TVar6 = Kernel::OperatorType::arg(this_00,idx);
      uVar4 = uVar4 + (uVar2 - 1) * iVar7;
      iVar7 = iVar7 * (this->_sizes)._array[*(uint *)(TVar6._content + 8)];
    }
    cVar1 = (this->_p_interpretation)._array[uVar4];
    if (cVar1 == '\0') {
      pUVar5 = (UserErrorException *)__cxa_allocate_exception(0x50);
      Kernel::Literal::toString_abi_cxx11_(&local_110,lit);
      std::operator+(&local_f0,"Could not evaluate ",&local_110);
      std::operator+(&local_d0,&local_f0,", probably a partial model");
      Lib::UserErrorException::Exception(pUVar5,&local_d0);
      __cxa_throw(pUVar5,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    bVar9 = cVar1 == '\x02';
  }
  uVar3 = (lit->super_Term)._args[0]._content;
  Lib::DArray<unsigned_int>::~DArray(&args);
  return (bool)((uVar3 & 4) == 0 ^ bVar9);
}

Assistant:

bool FiniteModelMultiSorted::evaluateGroundLiteral(Literal* lit)
{
  ASS(lit->ground());

#if DEBUG_MODEL
  cout << "Evaluating ground literal " << lit->toString() << endl;
#endif

  // evaluate all arguments
  unsigned arity = env.signature->predicateArity(lit->functor());
  DArray<unsigned> args(arity);
  for(unsigned i=0;i<arity;i++){
    args[i] = evaluateGroundTerm(lit->nthArgument(i)->term());
    if(args[i]==0) USER_ERROR("Could not evaluate "+lit->toString()+
                    " on "+(lit->nthArgument(i)->term()->toString())+
                    ", probably a partial model");
  }

  if(lit->isEquality()){
    bool res = args[0]==args[1];
#if DEBUG_MODEL
    cout << "Evaluate equality, args " << args[0] << " and " << args[1] << endl;
    cout << "res is " << (lit->polarity() ? res : !res) << endl;
#endif
    if(lit->polarity()) return res;
    else return !res;
  }

  OperatorType* sig = env.signature->getPredicate(lit->functor())->predType();
  unsigned var = _p_offsets[lit->functor()];
  unsigned mult = 1;
  for(unsigned i=0;i<args.size();i++){
    var += mult*(args[i]-1);
    unsigned s = sig->arg(i).term()->functor();
    mult *=_sizes[s];
  }

#if VDEBUG
  if((lit->functor()+1)<_p_offsets.size()) ASS_L(var,_p_offsets[lit->functor()+1]);
#endif
  ASS_L(var,_p_interpretation.size());

  char res = _p_interpretation[var];
#if DEBUG_MODEL
    cout << "res is " << res << " and polarity is " << lit->polarity() << endl;
#endif

  if(res==INTP_UNDEF)
    USER_ERROR("Could not evaluate "+lit->toString()+", probably a partial model");

  return (res==INTP_TRUE) == (lit->polarity());
}